

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

char * google::protobuf::FastInt32ToBuffer(int32 i,char *buffer)

{
  char *pcVar1;
  uint uVar2;
  char *pcVar3;
  byte *pbVar4;
  bool bVar5;
  
  buffer[0xb] = '\0';
  if (-1 < i) {
    pcVar3 = buffer + 0xb;
    do {
      pcVar1 = pcVar3 + -1;
      pcVar3[-1] = (char)i + (char)((uint)i / 10) * -10 | 0x30;
      bVar5 = 9 < (uint)i;
      i = (uint)i / 10;
      pcVar3 = pcVar1;
    } while (bVar5);
    return pcVar1;
  }
  if ((uint)i < 0xfffffff7) {
    uVar2 = -i - 10;
    buffer[10] = (char)uVar2 + (char)(uVar2 / 10) * -10 | 0x30;
    pbVar4 = (byte *)(buffer + 9);
    uVar2 = uVar2 / 10 + 1;
    do {
      *pbVar4 = (char)uVar2 + (char)(uVar2 / 10) * -10 | 0x30;
      pbVar4 = pbVar4 + -1;
      bVar5 = 9 < uVar2;
      uVar2 = uVar2 / 10;
    } while (bVar5);
  }
  else {
    buffer[10] = '0' - (char)i;
    pbVar4 = (byte *)(buffer + 9);
  }
  *pbVar4 = 0x2d;
  return (char *)pbVar4;
}

Assistant:

char *FastInt32ToBuffer(int32 i, char* buffer) {
  // We could collapse the positive and negative sections, but that
  // would be slightly slower for positive numbers...
  // 12 bytes is enough to store -2**32, -4294967296.
  char* p = buffer + kFastInt32ToBufferOffset;
  *p-- = '\0';
  if (i >= 0) {
    do {
      *p-- = '0' + i % 10;
      i /= 10;
    } while (i > 0);
    return p + 1;
  } else {
    // On different platforms, % and / have different behaviors for
    // negative numbers, so we need to jump through hoops to make sure
    // we don't divide negative numbers.
    if (i > -10) {
      i = -i;
      *p-- = '0' + i;
      *p = '-';
      return p;
    } else {
      // Make sure we aren't at MIN_INT, in which case we can't say i = -i
      i = i + 10;
      i = -i;
      *p-- = '0' + i % 10;
      // Undo what we did a moment ago
      i = i / 10 + 1;
      do {
        *p-- = '0' + i % 10;
        i /= 10;
      } while (i > 0);
      *p = '-';
      return p;
    }
  }
}